

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes.cc
# Opt level: O2

void __thiscall
cnn::LogSumExp::forward_impl
          (LogSumExp *this,vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *xs,
          Tensor *fx)

{
  pointer ppTVar1;
  CoeffReturnType pfVar2;
  pointer ppTVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  float fVar7;
  initializer_list<unsigned_int> x;
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> MStack_b8;
  Tensor v;
  Dim r;
  
  ppTVar1 = (xs->super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>).
            _M_impl.super__Vector_impl_data._M_start;
  ppTVar3 = (xs->super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>).
            _M_impl.super__Vector_impl_data._M_finish;
  if (((long)ppTVar3 - (long)ppTVar1 & 0x7fffffff8U) == 8) {
    fx->v = (*ppTVar1)->v;
  }
  else {
    uVar5 = 0;
    while( true ) {
      uVar6 = (ulong)uVar5;
      uVar4 = (long)ppTVar3 - (long)ppTVar1 >> 3;
      if (uVar4 <= uVar6) break;
      Tensor::operator*((Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> *)&v,
                        ppTVar1[uVar6]);
      pfVar2 = Eigen::
               DenseCoeffsBase<Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>,_0>
               ::operator()((DenseCoeffsBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                             *)&v,0,0);
      *(float *)((long)(this->super_Node).aux_mem + uVar6 * 4) = *pfVar2;
      uVar5 = uVar5 + 1;
      ppTVar1 = (xs->super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>).
                _M_impl.super__Vector_impl_data._M_start;
      ppTVar3 = (xs->super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>).
                _M_impl.super__Vector_impl_data._M_finish;
    }
    v.d.d[0] = (uint)uVar4;
    x._M_len = 1;
    x._M_array = (iterator)&v;
    Dim::Dim(&r,x);
    v.v = (float *)(this->super_Node).aux_mem;
    v.d.bd = r.bd;
    v.d.d[4] = r.d[4];
    v.d.d[5] = r.d[5];
    v.d.d[6] = r.d[6];
    v.d.nd = r.nd;
    v.d.d[0] = r.d[0];
    v.d.d[1] = r.d[1];
    v.d.d[2] = r.d[2];
    v.d.d[3] = r.d[3];
    v.bs.super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    v.bs.super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    v.bs.super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    Tensor::operator*(&MStack_b8,&v);
    fVar7 = logsumexp<Eigen::Map<Eigen::Matrix<float,_1,_1,0,_1,_1>,0,Eigen::Stride<0,0>>>
                      (&MStack_b8);
    *fx->v = fVar7;
    std::vector<cnn::Tensor,_std::allocator<cnn::Tensor>_>::~vector(&v.bs);
  }
  return;
}

Assistant:

void LogSumExp::forward_impl(const vector<const Tensor*>& xs, Tensor& fx) const {
  const unsigned num_args = xs.size();
  if (num_args == 1) {
    fx.v = xs[0]->v;
    return;
  }
  for (unsigned i = 0; i < xs.size(); ++i)
    static_cast<float*>(aux_mem)[i] = (**xs[i])(0,0);
  Dim r = {(unsigned int)xs.size()};
  Tensor v(r, static_cast<float*>(aux_mem));
  fx.v[0] = logsumexp(*v);
}